

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::FlushLogFiles(int min_severity)

{
  LogDestination *pLVar1;
  LogDestination *log;
  int i;
  lock_guard<std::mutex> l;
  int min_severity_local;
  
  l._M_device._4_4_ = min_severity;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe8,(mutex_type *)log_mutex);
  for (log._4_4_ = l._M_device._4_4_; (int)log._4_4_ < 4; log._4_4_ = log._4_4_ + GLOG_WARNING) {
    pLVar1 = log_destination(log._4_4_);
    if (pLVar1 != (LogDestination *)0x0) {
      (*pLVar1->logger_->_vptr_Logger[4])();
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(static_cast<LogSeverity>(i));
    if (log != nullptr) {
      log->logger_->Flush();
    }
  }
}